

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interval.cpp
# Opt level: O2

bool duckdb::Interval::FromString(string *str,interval_t *result)

{
  bool bVar1;
  string error_message;
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  bVar1 = FromCString((str->_M_dataplus)._M_p,str->_M_string_length,result,&local_28,false);
  ::std::__cxx11::string::~string((string *)&local_28);
  return bVar1;
}

Assistant:

bool Interval::FromString(const string &str, interval_t &result) {
	string error_message;
	return Interval::FromCString(str.c_str(), str.size(), result, &error_message, false);
}